

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_NeNull_R_Test<char32_t>::Body
          (iu_StrTest_x_iutest_x_NeNull_R_Test<char32_t> *this)

{
  iu_nullptr_convertible_t in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::internal::CmpHelperSTRNE<char32_t_const*>
            (&iutest_ar,(internal *)"TestFixture::Text::test","__null",text<char32_t>::test,
             (char32_t *)0x0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x56,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::internal::CmpHelperSTRNE<char32_t_const*>
            (&iutest_ar,(internal *)"TestFixture::Text::test","__null",text<char32_t>::test,
             (char32_t *)0x0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x57,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::internal::CmpHelperSTRNE<char32_t_const*>
            (&iutest_ar,(internal *)"TestFixture::Text::test","__null",text<char32_t>::test,
             (char32_t *)0x0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x58,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, NeNull_R)
{
    IUTEST_INFORM_STRNE(TestFixture::Text::test, NULL);
    IUTEST_EXPECT_STRNE(TestFixture::Text::test, NULL);
    IUTEST_ASSERT_STRNE(TestFixture::Text::test, NULL);
}